

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6695d7::InlineImageTracker::handleToken(InlineImageTracker *this,Token *token)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  *__v;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  QPDF *qpdf;
  ulong uVar3;
  undefined8 uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  size_type sVar6;
  InlineImageTracker *this_01;
  __index_type _Var7;
  bool bVar8;
  int iVar9;
  QPDF_Dictionary *pQVar10;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar11;
  _Base_ptr p_Var12;
  size_t in_RCX;
  char *pcVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf_00;
  void *__buf_01;
  undefined8 uVar14;
  pointer pcVar15;
  _Alloc_hider this_02;
  string name_1;
  string name;
  QPDFObjectHandle image;
  QPDFObjectHandle value;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> filters;
  QPDFObjectHandle dict;
  string image_data;
  undefined1 local_158 [32];
  string local_138;
  undefined1 local_118 [16];
  undefined1 local_108 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  string local_e8;
  QPDFObjectHandle local_c8;
  string local_b8;
  string *local_98;
  InlineImageTracker *local_90;
  BaseHandle local_88;
  shared_ptr<Buffer> local_78;
  QPDFObjectHandle local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ulong local_38;
  
  if (this->state == st_bi) {
    if (token->type == tt_inline_image) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      pcVar15 = (token->value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar15,pcVar15 + (token->value)._M_string_length);
      if (local_58._M_string_length < this->min_size) {
        QPDFObjectHandle::TokenFilter::write(&this->super_TokenFilter,(int)this + 0x50,__buf,in_RCX)
        ;
        QPDFObjectHandle::TokenFilter::writeToken(&this->super_TokenFilter,token);
        this->state = st_top;
      }
      else {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
        QPDFObjectHandle::parse(&local_68,&this->dict_str,&local_b8);
        QPDFObjectHandle::newDictionary();
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        local_138.field_2._M_allocated_capacity._0_6_ = 0x657079542f;
        local_138._M_string_length = 5;
        peVar2 = (element_type *)(local_158 + 0x10);
        local_158._16_8_ = 0x7463656a624f582f;
        local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x8;
        local_158[0x18] = '\0';
        local_158._0_8_ = peVar2;
        QPDFObjectHandle::newName((QPDFObjectHandle *)local_118,(string *)local_158);
        QPDFObjectHandle::replaceKey(&local_c8,&local_138,(QPDFObjectHandle *)local_118);
        if ((_Base_ptr)local_118._8_8_ != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
        }
        if ((element_type *)local_158._0_8_ != peVar2) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        local_138.field_2._M_allocated_capacity = 0x657079746275532f;
        local_138._M_string_length = 8;
        local_138.field_2._M_local_buf[8] = '\0';
        local_158._8_8_ = (_Base_ptr)0x6;
        local_158._16_7_ = 0x6567616d492f;
        local_158._0_8_ = peVar2;
        QPDFObjectHandle::newName((QPDFObjectHandle *)local_118,(string *)local_158);
        QPDFObjectHandle::replaceKey(&local_c8,&local_138,(QPDFObjectHandle *)local_118);
        if ((_Base_ptr)local_118._8_8_ != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
        }
        if ((element_type *)local_158._0_8_ != peVar2) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        local_88.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_68.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_88.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_68.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_68.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_68.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_68.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_68.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        pQVar10 = ::qpdf::BaseHandle::as<QPDF_Dictionary>(&local_88);
        local_38 = local_58._M_string_length;
        if (pQVar10 == (QPDF_Dictionary *)0x0) {
          p_Var12 = (_Base_ptr)0x0;
        }
        else {
          p_Var12 = (pQVar10->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        local_90 = this;
        pQVar10 = ::qpdf::BaseHandle::as<QPDF_Dictionary>(&local_88);
        uVar14 = &(pQVar10->items)._M_t._M_impl.super__Rb_tree_header;
        if (pQVar10 == (QPDF_Dictionary *)0x0) {
          uVar14 = (_Base_ptr)0x0;
        }
        if (p_Var12 != (_Base_ptr)uVar14) {
          local_98 = (string *)&local_90->resources;
          local_e8.field_2._8_8_ = uVar14;
          do {
            __v = *(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    **)(p_Var12 + 2);
            if (__v != (variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                        *)0x0) {
              _Var7 = (__v->
                      super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      ).
                      super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      .
                      super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      .
                      super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      .
                      super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      .
                      super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      ._M_index;
              if (_Var7 == '\x0f') {
                pvVar11 = std::
                          get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                                    (__v);
LAB_001dbbcc:
                _Var7 = *(__index_type *)
                         ((long)&(((pvVar11->obj).
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                  )->value).
                                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                         + 0x30);
              }
              else if (_Var7 == '\r') {
                pvVar11 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                           *)QPDF::resolve(*(QPDF **)((long)&__v[1].
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  ._M_u + 0x10),
                                           *(QPDFObjGen *)
                                            ((long)&__v[1].
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  ._M_u + 0x18));
                goto LAB_001dbbcc;
              }
              if (_Var7 != '\x02') {
                local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_138,*(long *)(p_Var12 + 1),
                           (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
                local_108._16_8_ = *(undefined8 *)(p_Var12 + 2);
                _Stack_f0._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var12[2]._M_parent;
                if ((_Base_ptr)_Stack_f0._M_pi != (_Base_ptr)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &((_Base_ptr)_Stack_f0._M_pi)->_M_parent)->_M_pi =
                         *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                  &((_Base_ptr)_Stack_f0._M_pi)->_M_parent)->_M_pi + 1;
                    UNLOCK();
                  }
                  else {
                    *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &((_Base_ptr)_Stack_f0._M_pi)->_M_parent)->_M_pi =
                         *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                  &((_Base_ptr)_Stack_f0._M_pi)->_M_parent)->_M_pi + 1;
                  }
                }
                iVar9 = std::__cxx11::string::compare((char *)&local_138);
                if (iVar9 == 0) {
                  pcVar13 = "/BitsPerComponent";
LAB_001dbd74:
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_138,0,(char *)local_138._M_string_length,(ulong)pcVar13);
                }
                else {
                  iVar9 = std::__cxx11::string::compare((char *)&local_138);
                  if (iVar9 == 0) {
                    pcVar13 = "/ColorSpace";
                    goto LAB_001dbd74;
                  }
                  iVar9 = std::__cxx11::string::compare((char *)&local_138);
                  if (iVar9 == 0) {
                    pcVar13 = "/Decode";
                    goto LAB_001dbd74;
                  }
                  iVar9 = std::__cxx11::string::compare((char *)&local_138);
                  if (iVar9 == 0) {
                    pcVar13 = "/DecodeParms";
                    goto LAB_001dbd74;
                  }
                  iVar9 = std::__cxx11::string::compare((char *)&local_138);
                  if (iVar9 == 0) {
                    pcVar13 = "/Filter";
                    goto LAB_001dbd74;
                  }
                  iVar9 = std::__cxx11::string::compare((char *)&local_138);
                  pcVar13 = "/Height";
                  if (iVar9 == 0) goto LAB_001dbd74;
                  iVar9 = std::__cxx11::string::compare((char *)&local_138);
                  if (iVar9 == 0) {
                    pcVar13 = "/ImageMask";
                    goto LAB_001dbd74;
                  }
                  iVar9 = std::__cxx11::string::compare((char *)&local_138);
                  pcVar13 = "/Interpolate";
                  if (iVar9 == 0) goto LAB_001dbd74;
                  iVar9 = std::__cxx11::string::compare((char *)&local_138);
                  if (iVar9 == 0) {
                    pcVar13 = "/Width";
                    goto LAB_001dbd74;
                  }
                }
                uVar14 = local_e8.field_2._8_8_;
                iVar9 = std::__cxx11::string::compare((char *)&local_138);
                if (iVar9 == 0) {
                  bVar8 = QPDFObjectHandle::isName((QPDFObjectHandle *)(local_108 + 0x10));
                  if (bVar8) {
                    QPDFObjectHandle::getName_abi_cxx11_
                              ((string *)local_158,(QPDFObjectHandle *)(local_108 + 0x10));
                    iVar9 = std::__cxx11::string::compare(local_158);
                    if (iVar9 == 0) {
                      pcVar13 = "/DeviceGray";
LAB_001dc2e3:
                      std::__cxx11::string::_M_replace
                                ((ulong)local_158,0,(char *)local_158._8_8_,(ulong)pcVar13);
                      uVar14 = local_e8.field_2._8_8_;
                    }
                    else {
                      iVar9 = std::__cxx11::string::compare(local_158);
                      if (iVar9 == 0) {
                        pcVar13 = "/DeviceRGB";
                        goto LAB_001dc2e3;
                      }
                      iVar9 = std::__cxx11::string::compare(local_158);
                      pcVar13 = "/DeviceCMYK";
                      if (iVar9 == 0) goto LAB_001dc2e3;
                      iVar9 = std::__cxx11::string::compare(local_158);
                      if (iVar9 == 0) {
                        pcVar13 = "/Indexed";
                        goto LAB_001dc2e3;
                      }
                      local_108._0_7_ = 0x53726f6c6f432f;
                      local_108._7_4_ = 0x65636170;
                      local_118._8_8_ = (_Base_ptr)0xb;
                      local_108[0xb] = 0;
                      local_118._0_8_ = (element_type *)local_108;
                      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_e8,local_98);
                      uVar14 = local_e8.field_2._8_8_;
                      if ((element_type *)local_118._0_8_ != (element_type *)local_108) {
                        operator_delete((void *)local_118._0_8_,
                                        CONCAT17(local_108[7],local_108._0_7_) + 1);
                      }
                      bVar8 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&local_e8);
                      if (bVar8) {
                        bVar8 = QPDFObjectHandle::hasKey
                                          ((QPDFObjectHandle *)&local_e8,(string *)local_158);
                        if (!bVar8) goto LAB_001dc272;
                        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_118,&local_e8);
                        _Var5._M_pi = _Stack_f0._M_pi;
                        _Stack_f0._M_pi =
                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
                        local_108._16_8_ = local_118._0_8_;
                        local_118._0_8_ = (element_type *)0x0;
                        local_118._8_8_ = (_Base_ptr)0x0;
                        if ((_Base_ptr)_Var5._M_pi != (_Base_ptr)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi)
                          ;
                        }
                        if ((_Base_ptr)local_118._8_8_ != (_Base_ptr)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_
                                    );
                        }
                      }
                      else {
LAB_001dc272:
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_118,"unable to resolve colorspace ",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_158);
                        QPDFObjectHandle::warnIfPossible
                                  ((QPDFObjectHandle *)local_98,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_118);
                        if ((element_type *)local_118._0_8_ != (element_type *)local_108) {
                          operator_delete((void *)local_118._0_8_,
                                          CONCAT17(local_108[7],local_108._0_7_) + 1);
                        }
                      }
                      local_158._8_8_ = (_Base_ptr)0x0;
                      *(char *)local_158._0_8_ = '\0';
                      if ((_Base_ptr)local_e8._M_string_length != (_Base_ptr)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   local_e8._M_string_length);
                      }
                    }
                    if ((_Base_ptr)local_158._8_8_ != (_Base_ptr)0x0) {
                      QPDFObjectHandle::newName((QPDFObjectHandle *)local_118,(string *)local_158);
                      _Var5._M_pi = _Stack_f0._M_pi;
                      _Stack_f0._M_pi =
                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
                      local_108._16_8_ = local_118._0_8_;
                      local_118._0_8_ = (element_type *)0x0;
                      local_118._8_8_ = (_Base_ptr)0x0;
                      if ((_Base_ptr)_Var5._M_pi != (_Base_ptr)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
                      }
                      if ((_Base_ptr)local_118._8_8_ != (_Base_ptr)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
                      }
                    }
                    if ((element_type *)local_158._0_8_ != (element_type *)(local_158 + 0x10)) {
                      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                    }
                  }
                }
                else {
                  iVar9 = std::__cxx11::string::compare((char *)&local_138);
                  if (iVar9 == 0) {
                    local_e8._M_dataplus._M_p = (pointer)0x0;
                    local_e8._M_string_length = 0;
                    local_e8.field_2._M_allocated_capacity = 0;
                    bVar8 = QPDFObjectHandle::isName((QPDFObjectHandle *)(local_108 + 0x10));
                    if (bVar8) {
                      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                                 &local_e8,(value_type *)(local_108 + 0x10));
                    }
                    else {
                      bVar8 = QPDFObjectHandle::isArray((QPDFObjectHandle *)(local_108 + 0x10));
                      if (bVar8) {
                        QPDFObjectHandle::getArrayAsVector
                                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                                   local_118,(QPDFObjectHandle *)(local_108 + 0x10));
                        local_158._8_8_ = local_e8._M_string_length;
                        local_158._0_8_ = local_e8._M_dataplus._M_p;
                        local_e8._M_dataplus._M_p = (pointer)local_118._0_8_;
                        local_e8._M_string_length = local_118._8_8_;
                        uVar3 = CONCAT17(local_108[7],local_108._0_7_);
                        local_158._16_8_ = local_e8.field_2._M_allocated_capacity;
                        local_118._0_8_ = (element_type *)0x0;
                        local_118._8_8_ = (_Base_ptr)0x0;
                        local_108._0_7_ = 0;
                        local_108._7_4_ = local_108._7_4_ & 0xffffff00;
                        local_e8.field_2._M_allocated_capacity = uVar3;
                        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                                   local_158);
                        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                                   local_118);
                      }
                    }
                    sVar6 = local_e8._M_string_length;
                    for (this_02._M_p = local_e8._M_dataplus._M_p; this_02._M_p != (pointer)sVar6;
                        this_02._M_p = (pointer)((long)&(((element_type *)this_02._M_p)->value).
                                                                                                                
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                + 0x10)) {
                      local_158._8_8_ = (_Base_ptr)0x0;
                      local_158._16_8_ = local_158._16_8_ & 0xffffffffffffff00;
                      local_158._0_8_ = (element_type *)(local_158 + 0x10);
                      bVar8 = QPDFObjectHandle::isName((QPDFObjectHandle *)this_02._M_p);
                      if (bVar8) {
                        QPDFObjectHandle::getName_abi_cxx11_
                                  ((string *)local_118,(QPDFObjectHandle *)this_02._M_p);
                        std::__cxx11::string::operator=((string *)local_158,(string *)local_118);
                        if ((element_type *)local_118._0_8_ != (element_type *)local_108) {
                          operator_delete((void *)local_118._0_8_,
                                          CONCAT17(local_108[7],local_108._0_7_) + 1);
                        }
                      }
                      iVar9 = std::__cxx11::string::compare(local_158);
                      if (iVar9 == 0) {
                        pcVar13 = "/ASCIIHexDecode";
LAB_001dc13e:
                        std::__cxx11::string::_M_replace
                                  ((ulong)local_158,0,(char *)local_158._8_8_,(ulong)pcVar13);
                      }
                      else {
                        iVar9 = std::__cxx11::string::compare(local_158);
                        if (iVar9 == 0) {
                          pcVar13 = "/ASCII85Decode";
                          goto LAB_001dc13e;
                        }
                        iVar9 = std::__cxx11::string::compare(local_158);
                        if (iVar9 == 0) {
                          pcVar13 = "/LZWDecode";
                          goto LAB_001dc13e;
                        }
                        iVar9 = std::__cxx11::string::compare(local_158);
                        if (iVar9 == 0) {
                          pcVar13 = "/FlateDecode";
                          goto LAB_001dc13e;
                        }
                        iVar9 = std::__cxx11::string::compare(local_158);
                        if (iVar9 == 0) {
                          pcVar13 = "/RunLengthDecode";
                          goto LAB_001dc13e;
                        }
                        iVar9 = std::__cxx11::string::compare(local_158);
                        pcVar13 = "/CCITTFaxDecode";
                        if (iVar9 == 0) goto LAB_001dc13e;
                        iVar9 = std::__cxx11::string::compare(local_158);
                        pcVar13 = "/DCTDecode";
                        if (iVar9 == 0) goto LAB_001dc13e;
                        local_158._8_8_ = (_Base_ptr)0x0;
                        *(char *)local_158._0_8_ = '\0';
                      }
                      if ((_Base_ptr)local_158._8_8_ != (_Base_ptr)0x0) {
                        QPDFObjectHandle::newName((QPDFObjectHandle *)local_118,(string *)local_158)
                        ;
                        uVar4 = local_118._8_8_;
                        uVar14 = local_118._0_8_;
                        local_118._0_8_ = (element_type *)0x0;
                        local_118._8_8_ = (_Base_ptr)0x0;
                        this_00 = (((BaseHandle *)&((element_type *)this_02._M_p)->value)->obj).
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
                        (((BaseHandle *)&((element_type *)this_02._M_p)->value)->obj).
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                             (element_type *)uVar14;
                        *(undefined8 *)
                         ((long)&(((element_type *)this_02._M_p)->value).
                                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                         + 8) = uVar4;
                        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                        }
                        if ((_Base_ptr)local_118._8_8_ != (_Base_ptr)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_
                                    );
                        }
                      }
                      if ((element_type *)local_158._0_8_ != (element_type *)(local_158 + 0x10)) {
                        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
                      }
                    }
                    bVar8 = QPDFObjectHandle::isName((QPDFObjectHandle *)(local_108 + 0x10));
                    uVar14 = local_e8.field_2._8_8_;
                    if ((bVar8) &&
                       (local_e8._M_string_length - (long)local_e8._M_dataplus._M_p == 0x10)) {
                      local_108._16_8_ = *(undefined8 *)local_e8._M_dataplus._M_p;
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                                (&_Stack_f0,
                                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                 ((long)local_e8._M_dataplus._M_p + 8));
                    }
                    else {
                      bVar8 = QPDFObjectHandle::isArray((QPDFObjectHandle *)(local_108 + 0x10));
                      if (bVar8) {
                        QPDFObjectHandle::newArray
                                  ((QPDFObjectHandle *)local_158,
                                   (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                                   &local_e8);
                        _Var5._M_pi = _Stack_f0._M_pi;
                        _Stack_f0._M_pi =
                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_;
                        local_108._16_8_ = local_158._0_8_;
                        local_158._0_8_ = (element_type *)0x0;
                        local_158._8_8_ = (_Base_ptr)0x0;
                        if ((_Base_ptr)_Var5._M_pi != (_Base_ptr)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi)
                          ;
                        }
                        if ((_Base_ptr)local_158._8_8_ != (_Base_ptr)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_
                                    );
                        }
                      }
                    }
                    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                               &local_e8);
                  }
                }
                QPDFObjectHandle::replaceKey
                          (&local_c8,&local_138,(QPDFObjectHandle *)(local_108 + 0x10));
                if ((_Base_ptr)_Stack_f0._M_pi != (_Base_ptr)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_f0._M_pi);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p,
                                  local_138.field_2._M_allocated_capacity + 1);
                }
              }
            }
            p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
          } while (p_Var12 != (_Base_ptr)uVar14);
        }
        pcVar15 = local_158 + 0x10;
        if (local_88.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        uVar3 = local_38;
        this_01 = local_90;
        if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"/Length","");
        if ((long)uVar3 < 0) {
          QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(uVar3);
        }
        QPDFObjectHandle::newInteger((QPDFObjectHandle *)local_158,uVar3);
        QPDFObjectHandle::replaceKey(&local_c8,&local_138,(QPDFObjectHandle *)local_158);
        if ((_Base_ptr)local_158._8_8_ != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        local_158._0_8_ = pcVar15;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/IIm","");
        QPDFObjectHandle::getUniqueResourceName
                  (&local_138,&this_01->resources,(string *)local_158,&this_01->min_suffix,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x0);
        if ((pointer)local_158._0_8_ != pcVar15) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        }
        qpdf = this_01->qpdf;
        local_78.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
        ;
        __args = &local_58;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<Buffer,std::allocator<Buffer>,std::__cxx11::string>
                  (&local_78.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (Buffer **)&local_78,(allocator<Buffer> *)local_158,__args);
        QPDFObjectHandle::newStream((QPDFObjectHandle *)local_118,qpdf,&local_78);
        if (local_78.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        QPDFObjectHandle::replaceDict((QPDFObjectHandle *)local_118,&local_c8);
        local_158._0_8_ = pcVar15;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"/XObject","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_b8,(string *)&this_01->resources);
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)&local_b8,&local_138,(QPDFObjectHandle *)local_118);
        __buf_00 = extraout_RDX;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
          __buf_00 = extraout_RDX_00;
        }
        if ((pointer)local_158._0_8_ != pcVar15) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
          __buf_00 = extraout_RDX_01;
        }
        QPDFObjectHandle::TokenFilter::write
                  (&this_01->super_TokenFilter,(int)&local_138,__buf_00,(size_t)__args);
        local_158._0_8_ = pcVar15;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_158," Do\n","");
        QPDFObjectHandle::TokenFilter::write
                  (&this_01->super_TokenFilter,(int)local_158,__buf_01,(size_t)__args);
        if ((pointer)local_158._0_8_ != pcVar15) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        }
        this_01->any_images = true;
        if ((_Base_ptr)local_118._8_8_ != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if (local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c8.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      paVar1 = &local_138.field_2;
      local_138._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"ID","");
      bVar8 = QPDFTokenizer::Token::isWord(token,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if (bVar8) {
        std::__cxx11::string::_M_append
                  ((char *)&this->bi_str,(ulong)(token->value)._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&this->dict_str);
      }
      else {
        local_138._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"EI","");
        bVar8 = QPDFTokenizer::Token::isWord(token,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar1) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if (bVar8) {
          this->state = st_top;
        }
        else {
          std::__cxx11::string::_M_append
                    ((char *)&this->bi_str,(ulong)(token->raw_value)._M_dataplus._M_p);
          std::__cxx11::string::_M_append
                    ((char *)&this->dict_str,(ulong)(token->raw_value)._M_dataplus._M_p);
        }
      }
    }
  }
  else {
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"BI","");
    bVar8 = QPDFTokenizer::Token::isWord(token,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (bVar8) {
      std::__cxx11::string::_M_assign((string *)&this->bi_str);
      std::__cxx11::string::_M_replace
                ((ulong)&this->dict_str,0,(char *)(this->dict_str)._M_string_length,0x27b77f);
      this->state = st_bi;
    }
    else {
      QPDFObjectHandle::TokenFilter::writeToken(&this->super_TokenFilter,token);
    }
  }
  return;
}

Assistant:

void
InlineImageTracker::handleToken(QPDFTokenizer::Token const& token)
{
    if (state == st_bi) {
        if (token.getType() == QPDFTokenizer::tt_inline_image) {
            std::string image_data(token.getValue());
            size_t len = image_data.length();
            if (len >= this->min_size) {
                QTC::TC("qpdf", "QPDFPageObjectHelper externalize inline image");
                QPDFObjectHandle dict = convertIIDict(QPDFObjectHandle::parse(dict_str));
                dict.replaceKey("/Length", QPDFObjectHandle::newInteger(QIntC::to_longlong(len)));
                std::string name = resources.getUniqueResourceName("/IIm", this->min_suffix);
                QPDFObjectHandle image = QPDFObjectHandle::newStream(
                    this->qpdf, std::make_shared<Buffer>(std::move(image_data)));
                image.replaceDict(dict);
                resources.getKey("/XObject").replaceKey(name, image);
                write(name);
                write(" Do\n");
                any_images = true;
            } else {
                QTC::TC("qpdf", "QPDFPageObjectHelper keep inline image");
                write(bi_str);
                writeToken(token);
                state = st_top;
            }
        } else if (token.isWord("ID")) {
            bi_str += token.getValue();
            dict_str += " >>";
        } else if (token.isWord("EI")) {
            state = st_top;
        } else {
            bi_str += token.getRawValue();
            dict_str += token.getRawValue();
        }
    } else if (token.isWord("BI")) {
        bi_str = token.getValue();
        dict_str = "<< ";
        state = st_bi;
    } else {
        writeToken(token);
    }
}